

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::PickNegLogSoftmax::forward_impl
          (PickNegLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  Tensor *pTVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  float *pfVar9;
  ulong uVar10;
  runtime_error *this_00;
  char *__function;
  ulong uVar11;
  ushort uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  float fVar21;
  int iVar22;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  scalar_sum_op<float,_float> local_d1;
  Tensor *local_d0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_c8;
  undefined1 local_a8 [16];
  MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  local_90;
  redux_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
  local_58;
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_d0 = fx;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"PickNegLogSoftmax::forward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pfVar9 = (float *)AlignedMemoryPool<6U>::allocate(fxs,(ulong)(fx->d).bd << 2);
  this->logz = pfVar9;
  if (this->pval == (uint *)0x0) {
    pvVar3 = this->pvals;
    if (pvVar3 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x48d,
                    "virtual void cnn::PickNegLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    if ((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)(local_d0->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x48e,
                    "virtual void cnn::PickNegLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    if ((this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar10 = 0;
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = (pTVar2->d).nd;
        iVar22 = 1;
        if ((ulong)uVar1 != 0) {
          auVar17 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar19 = vmovdqa64_avx512f(auVar18);
            auVar18 = vpbroadcastq_avx512f();
            auVar20 = vporq_avx512f(auVar18,auVar15);
            auVar18 = vporq_avx512f(auVar18,auVar16);
            uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar20,auVar17,2);
            bVar8 = (byte)uVar6;
            uVar12 = CONCAT11(bVar8,bVar7);
            auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar11));
            auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar18._4_4_;
            auVar20._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
            auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar18._8_4_;
            auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar18._12_4_;
            auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar18._16_4_;
            auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar18._20_4_;
            auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar18._24_4_;
            auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar18._28_4_;
            auVar20._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
            auVar20._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
            auVar20._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
            auVar20._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
            auVar20._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
            auVar20._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
            auVar20._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
            auVar20._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
            auVar18 = vpmulld_avx512f(auVar20,auVar19);
            uVar11 = uVar11 + 0x10;
          } while (((ulong)uVar1 + 0xf & 0xfffffffffffffff0) != uVar11);
          auVar15 = vmovdqa32_avx512f(auVar18);
          auVar16._0_4_ =
               (uint)(bVar7 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._0_4_;
          bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar16._4_4_ = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * auVar19._4_4_;
          bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar16._8_4_ = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * auVar19._8_4_;
          bVar4 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar16._12_4_ = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * auVar19._12_4_;
          bVar4 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar16._16_4_ = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * auVar19._16_4_;
          bVar4 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar16._20_4_ = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * auVar19._20_4_;
          bVar4 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar16._24_4_ = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * auVar19._24_4_;
          bVar4 = (bool)((byte)(uVar12 >> 7) & 1);
          auVar16._28_4_ = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * auVar19._28_4_;
          auVar16._32_4_ =
               (uint)(bVar8 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar19._32_4_;
          bVar4 = (bool)(bVar8 >> 1 & 1);
          auVar16._36_4_ = (uint)bVar4 * auVar15._36_4_ | (uint)!bVar4 * auVar19._36_4_;
          bVar4 = (bool)(bVar8 >> 2 & 1);
          auVar16._40_4_ = (uint)bVar4 * auVar15._40_4_ | (uint)!bVar4 * auVar19._40_4_;
          bVar4 = (bool)(bVar8 >> 3 & 1);
          auVar16._44_4_ = (uint)bVar4 * auVar15._44_4_ | (uint)!bVar4 * auVar19._44_4_;
          bVar4 = (bool)(bVar8 >> 4 & 1);
          auVar16._48_4_ = (uint)bVar4 * auVar15._48_4_ | (uint)!bVar4 * auVar19._48_4_;
          bVar4 = (bool)(bVar8 >> 5 & 1);
          auVar16._52_4_ = (uint)bVar4 * auVar15._52_4_ | (uint)!bVar4 * auVar19._52_4_;
          bVar4 = (bool)(bVar8 >> 6 & 1);
          auVar16._56_4_ = (uint)bVar4 * auVar15._56_4_ | (uint)!bVar4 * auVar19._56_4_;
          auVar16._60_4_ =
               (uint)(bVar8 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar19._60_4_;
          auVar14 = vextracti64x4_avx512f(auVar16,1);
          auVar15 = vpmulld_avx512f(auVar16,ZEXT3264(auVar14));
          auVar13 = vpmulld_avx(auVar15._0_16_,auVar15._16_16_);
          auVar5 = vpshufd_avx(auVar13,0xee);
          auVar13 = vpmulld_avx(auVar13,auVar5);
          auVar5 = vpshufd_avx(auVar13,0x55);
          auVar13 = vpmulld_avx(auVar13,auVar5);
          iVar22 = auVar13._0_4_;
        }
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar2->v + (uint)((int)(uVar10 % (ulong)(pTVar2->d).bd) * iVar22);
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(pTVar2->d).d[0];
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar2->d).d[1];
        if (uVar1 < 2) {
          local_c8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if ((local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value == 0) ||
           ((int)local_c8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value == 0)) goto LAB_0017f505;
        local_90.m_expression._0_8_ =
             local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
        local_90.m_expression.m_xpr.m_expression.m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        auVar15._0_4_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>,3,0>
             ::run<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                       ((redux_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)&local_90,(scalar_max_op<float,_float,_0> *)&local_58,&local_c8);
        auVar15._4_60_ = extraout_var_00;
        local_a8 = auVar15._0_16_;
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar13 = vpxord_avx512vl(local_a8,auVar13);
        local_90.m_expression.m_xpr.m_expression.m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value =
             local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value;
        local_90.m_expression.m_xpr.m_expression.m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_c8.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_90.m_expression.m_xpr.m_expression.m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_90.m_expression.m_xpr.m_expression.m_functor.c = auVar13._0_4_;
        if (local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value == 0 ||
            local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value == 0) {
          fVar21 = 0.0;
        }
        else {
          if ((local_c8.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value < 1) ||
             (local_c8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value < 1)) goto LAB_0017f53b;
          local_58.
          super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .
          super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.
          super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .
          super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.
          super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
          .
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
          .m_data = local_c8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_58.
          super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .
          super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.
          super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .
          super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.
          super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
          .
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
          .m_outerStride.m_value =
               local_c8.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_58.
          super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .
          super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.
          super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .
          super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
          .
          super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          .m_argImpl.
          super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
          .m_d.op.c = local_90.m_expression.m_xpr.m_expression.m_functor.c;
          fVar21 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>const>const>const>>,3,0>
                   ::
                   run<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>const>const>const>>
                             (&local_58,&local_d1,&local_90);
        }
        fVar21 = logf(fVar21);
        this->logz[uVar10] = fVar21 + (float)local_a8._0_4_;
        uVar11 = (ulong)(this->pvals->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
        if (local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value - uVar11 == 0 ||
            local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_c8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value < (long)uVar11) goto LAB_0017f51c;
        local_d0->v[uVar10] =
             (fVar21 + (float)local_a8._0_4_) -
             local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[uVar11];
        uVar10 = (ulong)((int)uVar10 + 1);
        auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar10 < (ulong)((long)(this->pvals->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->pvals->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  else {
    Tensor::operator*(&local_c8,
                      *(xs->
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if ((local_c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value < 1) ||
       (local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value < 1)) {
LAB_0017f505:
      __function = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::redux(const Func &) const [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BinaryOp = Eigen::internal::scalar_max_op<float>]"
      ;
LAB_0017f550:
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,__function);
    }
    local_90.m_expression._0_8_ =
         local_c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data;
    local_90.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    auVar17._0_4_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>,3,0>
         ::run<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                   ((redux_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)&local_90,(scalar_max_op<float,_float,_0> *)&local_58,&local_c8);
    auVar17._4_60_ = extraout_var;
    local_a8 = auVar17._0_16_;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(local_a8,auVar5);
    local_90.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_90.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_90.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_90.m_expression.m_xpr.m_expression.m_functor.c = auVar13._0_4_;
    if (local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value == 0 ||
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value == 0) {
      fVar21 = 0.0;
    }
    else {
      if ((local_c8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value < 1) ||
         (local_c8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value < 1)) {
LAB_0017f53b:
        __function = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::MatrixWrapper<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<cnn::const_add_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>>>::redux(const Func &) const [Derived = Eigen::MatrixWrapper<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<cnn::const_add_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
        ;
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_90.m_expression.m_xpr.m_expression.m_xpr.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_90.m_expression.m_xpr.m_expression.m_xpr.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value =
             local_90.m_expression.m_xpr.m_expression.m_xpr.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value;
        goto LAB_0017f550;
      }
      local_58.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_c8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_58.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_c8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_58.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.op.c = local_90.m_expression.m_xpr.m_expression.m_functor.c;
      fVar21 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>const>const>const>>,3,0>
               ::
               run<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>const>const>const>>
                         (&local_58,&local_d1,&local_90);
    }
    fVar21 = logf(fVar21);
    *this->logz = fVar21 + (float)local_a8._0_4_;
    uVar10 = (ulong)*this->pval;
    if (local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar10 == 0 ||
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_c8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar10) {
LAB_0017f51c:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    *local_d0->v = (fVar21 + (float)local_a8._0_4_) -
                   local_c8.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data[uVar10];
  }
  return;
}

Assistant:

void PickNegLogSoftmax::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
    logz = (float*)fxs->allocate(sizeof(float)*fx.d.batch_elems());
#if HAVE_CUDA
    if(pval) {
      gpu::pnlsoftmax(xs[0]->d.size(), *pval, xs[0]->v, fx.v, logz);
    } else {
      // TODO: It'd be nice to have a kernel that did all batches at once
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems());
      for(unsigned b = 0; b < pvals->size(); ++b)
        gpu::pnlsoftmax(xs[0]->d.batch_size(), (*pvals)[b], xs[0]->batch_ptr(b), fx.v+b, logz+b);
    }
#else
    if(pval) {
      auto x = **xs[0];
      *logz = logsumexp(x);
      fx.v[0] = *logz - x(*pval);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems());
      for(unsigned b = 0; b < pvals->size(); ++b) {
        auto x = xs[0]->batch_matrix(b);
        logz[b] = logsumexp(x);
        fx.v[b] = logz[b] - x((*pvals)[b]);
      }
    }
#endif
  } else {
    throw std::runtime_error("PickNegLogSoftmax::forward not yet implemented for multiple columns");
  }
}